

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletutil.h
# Opt level: O2

void __thiscall wallet::WalletDescriptor::DeserializeDescriptor(WalletDescriptor *this,string *str)

{
  long lVar1;
  reference __r;
  string *psVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  descs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  FlatSigningProvider keys;
  string error;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keys.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FlatSigningProvider_01158e68;
  keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys.origins._M_t._M_impl.super__Rb_tree_header._M_header;
  keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys.keys._M_t._M_impl.super__Rb_tree_header._M_header;
  keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
  keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Parse(&descs,str,&keys,&error,true);
  if (descs.
      super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      descs.
      super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar2 = (string *)__cxa_allocate_exception(0x20);
    std::operator+(&local_158,"Invalid descriptor: ",&error);
    std::ios_base::failure[abi:cxx11]::failure(psVar2);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(psVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else if ((ulong)((long)descs.
                         super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)descs.
                        super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) < 9) {
    __r = std::
          vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
          ::at(&descs,0);
    std::__shared_ptr<Descriptor,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Descriptor,(__gnu_cxx::_Lock_policy)2> *)this,__r);
    DescriptorID((uint256 *)&local_158,
                 (this->descriptor).super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    *(size_type *)((this->id).super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_158.field_2._M_allocated_capacity;
    *(undefined8 *)((this->id).super_base_blob<256U>.m_data._M_elems + 0x18) =
         local_158.field_2._8_8_;
    *(ulong *)(this->id).super_base_blob<256U>.m_data._M_elems =
         CONCAT44(local_158._M_dataplus._M_p._4_4_,local_158._M_dataplus._M_p._0_4_);
    *(size_type *)((this->id).super_base_blob<256U>.m_data._M_elems + 8) =
         local_158._M_string_length;
    std::
    vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
    ::~vector(&descs);
    FlatSigningProvider::~FlatSigningProvider(&keys);
    std::__cxx11::string::~string((string *)&error);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    pcVar3 = (char *)__cxa_allocate_exception(0x20);
    local_158._M_string_length = std::iostream_category();
    local_158._M_dataplus._M_p._0_4_ = 1;
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar3,(error_code *)"Can\'t load a multipath descriptor from databases");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

void DeserializeDescriptor(const std::string& str)
    {
        std::string error;
        FlatSigningProvider keys;
        auto descs = Parse(str, keys, error, true);
        if (descs.empty()) {
            throw std::ios_base::failure("Invalid descriptor: " + error);
        }
        if (descs.size() > 1) {
            throw std::ios_base::failure("Can't load a multipath descriptor from databases");
        }
        descriptor = std::move(descs.at(0));
        id = DescriptorID(*descriptor);
    }